

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scrypt_test.cc
# Opt level: O0

bool GetUint64(FileTest *t,uint64_t *out,char *name)

{
  undefined8 __s;
  bool bVar1;
  uint uVar2;
  char *__nptr;
  ulonglong uVar3;
  bool local_a3;
  char *local_88;
  char *endptr;
  allocator<char> local_69;
  string local_68;
  undefined1 local_48 [8];
  string str;
  char *name_local;
  uint64_t *out_local;
  FileTest *t_local;
  
  str.field_2._8_8_ = name;
  std::__cxx11::string::string((string *)local_48);
  __s = str.field_2._8_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,(char *)__s,&local_69);
  bVar1 = FileTest::GetAttribute(t,(string *)local_48,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __nptr = (char *)std::__cxx11::string::data();
    uVar3 = strtoull(__nptr,&local_88,10);
    *out = uVar3;
    uVar2 = std::__cxx11::string::empty();
    local_a3 = false;
    if ((uVar2 & 1) == 0) {
      local_a3 = *local_88 == '\0';
    }
    t_local._7_1_ = local_a3;
  }
  else {
    t_local._7_1_ = false;
  }
  endptr._0_4_ = 1;
  std::__cxx11::string::~string((string *)local_48);
  return t_local._7_1_;
}

Assistant:

static bool GetUint64(FileTest *t, uint64_t *out, const char *name) {
  std::string str;
  if (!t->GetAttribute(&str, name)) {
    return false;
  }

  char *endptr;
  *out = strtoull(str.data(), &endptr, 10);
  return !str.empty() && *endptr == '\0';
}